

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Preprocessor_pragmas.cpp
# Opt level: O2

void __thiscall
slang::parsing::Preprocessor::handleProtectViewport
          (Preprocessor *this,Token keyword,PragmaExpressionSyntax *args,
          SmallVectorBase<slang::parsing::Token> *param_3)

{
  bool bVar1;
  string_view name;
  string_view name_00;
  SourceRange range;
  PragmaExpressionSyntax *args_local;
  Token keyword_local;
  anon_class_16_2_3edefdfa checkOption;
  
  keyword_local.info = keyword.info;
  keyword_local._0_8_ = keyword._0_8_;
  args_local = args;
  if (args == (PragmaExpressionSyntax *)0x0) {
    range = Token::range(&keyword_local);
  }
  else {
    if (((args->super_SyntaxNode).kind == ParenPragmaExpression) &&
       (((ulong)((long)&(args[3].super_SyntaxNode.previewNode)->kind + 1U) & 0xfffffffffffffffe) ==
        4)) {
      checkOption.args = &args_local;
      name._M_str = "object";
      name._M_len = 6;
      checkOption.this = this;
      bVar1 = handleProtectViewport::anon_class_16_2_3edefdfa::operator()(&checkOption,0,name);
      if (!bVar1) {
        return;
      }
      name_00._M_str = "access";
      name_00._M_len = 6;
      handleProtectViewport::anon_class_16_2_3edefdfa::operator()(&checkOption,1,name_00);
      return;
    }
    range = slang::syntax::SyntaxNode::sourceRange(&args->super_SyntaxNode);
  }
  addDiag(this,(DiagCode)0x250004,range);
  return;
}

Assistant:

void Preprocessor::handleProtectViewport(Token keyword, const PragmaExpressionSyntax* args,
                                         SmallVectorBase<Token>&) {
    if (!args || args->kind != SyntaxKind::ParenPragmaExpression ||
        args->as<ParenPragmaExpressionSyntax>().values.size() != 2) {
        addDiag(diag::InvalidPragmaViewport, args ? args->sourceRange() : keyword.range());
        return;
    }

    auto checkOption = [&](size_t index, std::string_view name) {
        auto syntax = args->as<ParenPragmaExpressionSyntax>().values[index];
        if (syntax->kind != SyntaxKind::NameValuePragmaExpression) {
            addDiag(diag::InvalidPragmaViewport, syntax->sourceRange());
            return false;
        }

        auto& nvp = syntax->as<NameValuePragmaExpressionSyntax>();
        if (nvp.name.valueText() != name) {
            addDiag(diag::InvalidPragmaViewport, nvp.name.range());
            return false;
        }

        if (nvp.value->kind != SyntaxKind::SimplePragmaExpression ||
            nvp.value->as<SimplePragmaExpressionSyntax>().value.kind != TokenKind::StringLiteral) {
            addDiag(diag::InvalidPragmaViewport, nvp.value->sourceRange());
            return false;
        }

        return true;
    };

    if (!checkOption(0, "object"sv))
        return;

    checkOption(1, "access"sv);
}